

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O1

bool __thiscall
spirv_cross::CompilerMSL::is_out_of_bounds_tessellation_level(CompilerMSL *this,uint32_t id_lhs)

{
  Variant *pVVar1;
  uint32_t uVar2;
  SPIREntryPoint *pSVar3;
  SPIRExpression *pSVar4;
  ulong uVar5;
  SPIRConstant *pSVar6;
  
  uVar5 = (ulong)id_lhs;
  pSVar3 = Compiler::get_entry_point((Compiler *)this);
  if (((pSVar3->flags).lower & 0x400000) != 0) {
    if ((uVar5 < (this->super_CompilerGLSL).super_Compiler.ir.ids.
                 super_VectorView<spirv_cross::Variant>.buffer_size) &&
       (pVVar1 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
                 super_VectorView<spirv_cross::Variant>.ptr, pVVar1[uVar5].type == TypeExpression))
    {
      pSVar4 = Variant::get<spirv_cross::SPIRExpression>(pVVar1 + uVar5);
    }
    else {
      pSVar4 = (SPIRExpression *)0x0;
    }
    if (((pSVar4 != (SPIRExpression *)0x0) && (pSVar4->access_chain == true)) &&
       (uVar2 = Compiler::get_decoration
                          ((Compiler *)this,(ID)(pSVar4->loaded_from).id,DecorationBuiltIn),
       0xfffffffd < uVar2 - 0xd)) {
      uVar5 = (ulong)(pSVar4->implied_read_expressions).
                     super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr[1].id;
      if ((uVar5 < (this->super_CompilerGLSL).super_Compiler.ir.ids.
                   super_VectorView<spirv_cross::Variant>.buffer_size) &&
         (pVVar1 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
                   super_VectorView<spirv_cross::Variant>.ptr, pVVar1[uVar5].type == TypeConstant))
      {
        pSVar6 = Variant::get<spirv_cross::SPIRConstant>(pVVar1 + uVar5);
      }
      else {
        pSVar6 = (SPIRConstant *)0x0;
      }
      if (pSVar6 != (SPIRConstant *)0x0) {
        if (uVar2 == 0xb) {
          return (pSVar6->m).c[0].r[0].u32 == 3;
        }
        if ((uVar2 == 0xc) && ((pSVar6->m).c[0].r[0].u32 == 1)) {
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

bool CompilerMSL::is_out_of_bounds_tessellation_level(uint32_t id_lhs)
{
	if (!get_entry_point().flags.get(ExecutionModeTriangles))
		return false;

	// In SPIR-V, TessLevelInner always has two elements and TessLevelOuter always has
	// four. This is true even if we are tessellating triangles. This allows clients
	// to use a single tessellation control shader with multiple tessellation evaluation
	// shaders.
	// In Metal, however, only the first element of TessLevelInner and the first three
	// of TessLevelOuter are accessible. This stems from how in Metal, the tessellation
	// levels must be stored to a dedicated buffer in a particular format that depends
	// on the patch type. Therefore, in Triangles mode, any access to the second
	// inner level or the fourth outer level must be dropped.
	const auto *e = maybe_get<SPIRExpression>(id_lhs);
	if (!e || !e->access_chain)
		return false;
	BuiltIn builtin = BuiltIn(get_decoration(e->loaded_from, DecorationBuiltIn));
	if (builtin != BuiltInTessLevelInner && builtin != BuiltInTessLevelOuter)
		return false;
	auto *c = maybe_get<SPIRConstant>(e->implied_read_expressions[1]);
	if (!c)
		return false;
	return (builtin == BuiltInTessLevelInner && c->scalar() == 1) ||
	       (builtin == BuiltInTessLevelOuter && c->scalar() == 3);
}